

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O0

Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> * __thiscall
Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>,_1>::operator=
          (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1> *this,
          MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1> *other)

{
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *pBVar1;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>_> *in_RDI;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>_> *unaff_retaddr;
  
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>_>::operator=
            (unaff_retaddr,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>_> *)
             in_RDI);
  pBVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>_>::derived
                     (in_RDI);
  return pBVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    Derived& operator=(const MapBase& other)
    {
      ReadOnlyMapBase::Base::operator=(other);
      return derived();
    }